

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<std::pair<int,_int>_>::Resize
          (TPZVec<std::pair<int,_int>_> *this,int64_t newsize,pair<int,_int> *object)

{
  pair<int,_int> pVar1;
  pair<int,_int> *ppVar2;
  pair<int,_int> *__s;
  long lVar3;
  long lVar4;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar4 = this->fNElements;
  if (lVar4 != newsize) {
    if (newsize == 0) {
      __s = (pair<int,_int> *)0x0;
    }
    else {
      __s = (pair<int,_int> *)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | newsize * 8);
      memset(__s,0,newsize * 8);
    }
    if (newsize <= lVar4) {
      lVar4 = newsize;
    }
    if (lVar4 < 1) {
      lVar3 = 0;
    }
    else {
      ppVar2 = this->fStore;
      lVar3 = 0;
      do {
        __s[lVar3] = ppVar2[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar4 != lVar3);
    }
    if (lVar3 < newsize) {
      pVar1 = *object;
      do {
        __s[lVar3] = pVar1;
        lVar3 = lVar3 + 1;
      } while (newsize != lVar3);
    }
    if (this->fStore != (pair<int,_int> *)0x0) {
      operator_delete__(this->fStore);
      this->fStore = (pair<int,_int> *)0x0;
    }
    this->fStore = __s;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}